

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# UriParse.c
# Opt level: O3

UriBool uriOnExitSegmentNzNcOrScheme2W
                  (UriParserStateW *state,wchar_t *first,UriMemoryManager *memory)

{
  wchar_t *pwVar1;
  UriUriW *pUVar2;
  UriBool UVar3;
  UriPathSegmentStructW *pUVar4;
  
  pwVar1 = (state->uri->scheme).first;
  pUVar4 = (UriPathSegmentStructW *)(*memory->calloc)(memory,1,0x20);
  if (pUVar4 == (UriPathSegmentStructW *)0x0) {
    UVar3 = 0;
  }
  else {
    if (pwVar1 == first) {
      first = anon_var_dwarf_f85ea;
      pwVar1 = anon_var_dwarf_f85ea;
    }
    (pUVar4->text).first = pwVar1;
    (pUVar4->text).afterLast = first;
    pUVar2 = state->uri;
    if (pUVar2->pathHead == (UriPathSegmentW *)0x0) {
      pUVar2->pathHead = pUVar4;
    }
    else {
      pUVar2->pathTail->next = pUVar4;
    }
    pUVar2->pathTail = pUVar4;
    (pUVar2->scheme).first = (wchar_t *)0x0;
    UVar3 = 1;
  }
  return UVar3;
}

Assistant:

static URI_INLINE UriBool URI_FUNC(OnExitSegmentNzNcOrScheme2)(
		URI_TYPE(ParserState) * state, const URI_CHAR * first,
		UriMemoryManager * memory) {
	if (!URI_FUNC(PushPathSegment)(state, state->uri->scheme.first, first, memory)) { /* SEGMENT BOTH */
		return URI_FALSE; /* Raises malloc error*/
	}
	state->uri->scheme.first = NULL; /* Not a scheme, reset */
	return URI_TRUE; /* Success */
}